

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QStatusBarPrivate::SBItem>::moveAppend
          (QGenericArrayOps<QStatusBarPrivate::SBItem> *this,SBItem *b,SBItem *e)

{
  undefined8 uVar1;
  SBItem *pSVar2;
  SBItem *pSVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  SBItem *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    pSVar2 = QArrayDataPointer<QStatusBarPrivate::SBItem>::begin
                       ((QArrayDataPointer<QStatusBarPrivate::SBItem> *)0x6a74a7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pSVar3 = pSVar2 + *(long *)(in_RDI + 0x10);
      pSVar3->widget = (QWidget *)*local_10;
      uVar1 = local_10[1];
      pSVar3->stretch = (int)uVar1;
      pSVar3->category = (int)((ulong)uVar1 >> 0x20);
      local_10 = local_10 + 2;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }